

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O0

void __thiscall bloaty::Options::MergeFrom(Options *this,Options *from)

{
  uint uVar1;
  int64 value;
  Options *in_RSI;
  Options *in_RDI;
  uint32 cached_has_bits;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  LogMessage *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  LogMessage *in_stack_fffffffffffffee0;
  LogMessage *this_00;
  InternalMetadataWithArena *this_01;
  ArenaStringPtr in_stack_fffffffffffffef0;
  string local_c8;
  Options *local_90;
  InternalMetadataWithArena *local_80;
  InternalMetadataWithArena *local_78;
  undefined4 local_6c;
  HasBits<1UL> *local_68;
  undefined4 local_5c;
  HasBits<1UL> *local_58;
  undefined4 local_4c;
  HasBits<1UL> *local_48;
  undefined4 local_3c;
  HasBits<1UL> *local_38;
  InternalMetadataWithArena *local_30;
  InternalMetadataWithArena *local_28;
  Container *local_20;
  InternalMetadataWithArena *local_18;
  InternalMetadataWithArena *local_10;
  InternalMetadataWithArena *local_8;
  
  local_90 = in_RSI;
  if (in_RSI == in_RDI) {
    in_stack_fffffffffffffef0.ptr_ = &local_c8;
    google::protobuf::internal::LogMessage::LogMessage
              (in_stack_fffffffffffffee0,
               (LogLevel_conflict)((ulong)in_stack_fffffffffffffed8 >> 0x20),
               (char *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
    google::protobuf::internal::LogMessage::operator<<
              (in_stack_fffffffffffffed0,
               (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    google::protobuf::internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffed0,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)0x1b754b);
  }
  this_01 = &in_RDI->_internal_metadata_;
  this_00 = (LogMessage *)&local_90->_internal_metadata_;
  local_80 = (InternalMetadataWithArena *)this_00;
  local_78 = this_01;
  local_30 = (InternalMetadataWithArena *)this_00;
  local_8 = (InternalMetadataWithArena *)this_00;
  if (((uint)(((InternalMetadataWithArena *)this_00)->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_28 = (InternalMetadataWithArena *)this_00;
    local_18 = (InternalMetadataWithArena *)this_00;
    local_10 = (InternalMetadataWithArena *)this_00;
    if (((uint)(((InternalMetadataWithArena *)this_00)->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                           ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                             *)this_00);
      in_stack_fffffffffffffee0 = this_00;
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArena::default_instance();
      in_stack_fffffffffffffee0 = this_00;
    }
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              ((InternalMetadataWithArena *)in_stack_fffffffffffffed0,
               (UnknownFieldSet *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  }
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffed0,
              (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffed0,
              (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffed0,
              (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  google::protobuf::RepeatedPtrField<bloaty::CustomDataSource>::MergeFrom
            ((RepeatedPtrField<bloaty::CustomDataSource> *)in_stack_fffffffffffffed0,
             (RepeatedPtrField<bloaty::CustomDataSource> *)
             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffed0,
              (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffed0,
              (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  local_38 = &local_90->_has_bits_;
  local_3c = 0;
  uVar1 = local_38->has_bits_[0];
  if ((uVar1 & 0xff) != 0) {
    if ((uVar1 & 1) != 0) {
      local_48 = &in_RDI->_has_bits_;
      local_4c = 0;
      local_48->has_bits_[0] = local_48->has_bits_[0] | 1;
      google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      google::protobuf::internal::ArenaStringPtr::AssignWithDefault
                ((ArenaStringPtr *)this_01,(string *)in_stack_fffffffffffffee0,
                 in_stack_fffffffffffffef0);
    }
    if ((uVar1 & 2) != 0) {
      local_58 = &in_RDI->_has_bits_;
      local_5c = 0;
      local_58->has_bits_[0] = local_58->has_bits_[0] | 2;
      google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      google::protobuf::internal::ArenaStringPtr::AssignWithDefault
                ((ArenaStringPtr *)this_01,(string *)in_stack_fffffffffffffee0,
                 in_stack_fffffffffffffef0);
    }
    if ((uVar1 & 4) != 0) {
      in_RDI->demangle_ = local_90->demangle_;
    }
    if ((uVar1 & 8) != 0) {
      in_RDI->sort_by_ = local_90->sort_by_;
    }
    if ((uVar1 & 0x10) != 0) {
      in_RDI->verbose_level_ = local_90->verbose_level_;
    }
    if ((uVar1 & 0x20) != 0) {
      in_RDI->dump_raw_map_ = (bool)(local_90->dump_raw_map_ & 1);
    }
    if ((uVar1 & 0x40) != 0) {
      in_RDI->debug_vmaddr_ = local_90->debug_vmaddr_;
    }
    if ((uVar1 & 0x80) != 0) {
      in_RDI->debug_fileoff_ = local_90->debug_fileoff_;
    }
    local_68 = &in_RDI->_has_bits_;
    local_6c = 0;
    local_68->has_bits_[0] = uVar1 | local_68->has_bits_[0];
  }
  if ((uVar1 & 0x100) != 0) {
    value = _internal_max_rows_per_level(local_90);
    _internal_set_max_rows_per_level(in_RDI,value);
  }
  return;
}

Assistant:

void Options::MergeFrom(const Options& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:bloaty.Options)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  filename_.MergeFrom(from.filename_);
  base_filename_.MergeFrom(from.base_filename_);
  data_source_.MergeFrom(from.data_source_);
  custom_data_source_.MergeFrom(from.custom_data_source_);
  debug_filename_.MergeFrom(from.debug_filename_);
  source_map_.MergeFrom(from.source_map_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x000000ffu) {
    if (cached_has_bits & 0x00000001u) {
      _has_bits_[0] |= 0x00000001u;
      disassemble_function_.AssignWithDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from.disassemble_function_);
    }
    if (cached_has_bits & 0x00000002u) {
      _has_bits_[0] |= 0x00000002u;
      source_filter_.AssignWithDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from.source_filter_);
    }
    if (cached_has_bits & 0x00000004u) {
      demangle_ = from.demangle_;
    }
    if (cached_has_bits & 0x00000008u) {
      sort_by_ = from.sort_by_;
    }
    if (cached_has_bits & 0x00000010u) {
      verbose_level_ = from.verbose_level_;
    }
    if (cached_has_bits & 0x00000020u) {
      dump_raw_map_ = from.dump_raw_map_;
    }
    if (cached_has_bits & 0x00000040u) {
      debug_vmaddr_ = from.debug_vmaddr_;
    }
    if (cached_has_bits & 0x00000080u) {
      debug_fileoff_ = from.debug_fileoff_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  if (cached_has_bits & 0x00000100u) {
    _internal_set_max_rows_per_level(from._internal_max_rows_per_level());
  }
}